

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_newname_block(nghttp2_bufs *bufs,nghttp2_nv *nv,int indexing_mode)

{
  uint8_t b;
  int rv;
  int indexing_mode_local;
  nghttp2_nv *nv_local;
  nghttp2_bufs *bufs_local;
  
  b = pack_first_byte(indexing_mode);
  bufs_local._4_4_ = nghttp2_bufs_addb(bufs,b);
  if (((bufs_local._4_4_ == 0) &&
      (bufs_local._4_4_ = emit_string(bufs,nv->name,nv->namelen), bufs_local._4_4_ == 0)) &&
     (bufs_local._4_4_ = emit_string(bufs,nv->value,nv->valuelen), bufs_local._4_4_ == 0)) {
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

static int emit_newname_block(nghttp2_bufs *bufs, const nghttp2_nv *nv,
                              int indexing_mode) {
  int rv;

  DEBUGF(
      "deflatehd: emit newname namelen=%zu, valuelen=%zu, indexing_mode=%d\n",
      nv->namelen, nv->valuelen, indexing_mode);

  rv = nghttp2_bufs_addb(bufs, pack_first_byte(indexing_mode));
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->name, nv->namelen);
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->value, nv->valuelen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}